

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePickerPrivate::releaseScrolling(DateTimePickerPrivate *this)

{
  this->leftMouseButtonPressed = false;
  clearOffset(this);
  updateDaysIfNeeded(this);
  updateCurrentDateTime(this);
  this->movableSection = -1;
  QWidget::update();
  return;
}

Assistant:

void
DateTimePickerPrivate::releaseScrolling()
{
	leftMouseButtonPressed = false;

	clearOffset();
	updateDaysIfNeeded();
	updateCurrentDateTime();

	movableSection = -1;

	q->update();
}